

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O3

string * __thiscall
cfd::core::JsonObjectVector<cfd::js::api::json::PsbtBip32Data,cfd::js::api::PsbtBip32DataStruct>::
Serialize_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  long *plVar1;
  _Node *p_Var2;
  char *pcVar3;
  bool bVar4;
  long *plVar5;
  _List_node_base *p_Var6;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  str_list;
  string item;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar3 = (char *)0x0;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_68._M_impl._M_node._M_size = 0;
  plVar5 = *(long **)((long)this + 8);
  plVar1 = *(long **)((long)this + 0x10);
  local_68._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_68;
  local_68._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_68;
  if (plVar5 != plVar1) {
    do {
      (**(code **)(*plVar5 + 0x30))(&local_50,plVar5);
      p_Var2 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
               _M_create_node<std::__cxx11::string_const&>
                         ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                          &local_68,&local_50);
      std::__detail::_List_node_base::_M_hook(&p_Var2->super__List_node_base);
      local_68._M_impl._M_node._M_size = local_68._M_impl._M_node._M_size + 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      plVar5 = plVar5 + 0x17;
    } while (plVar5 != plVar1);
    pcVar3 = (char *)__return_storage_ptr__->_M_string_length;
  }
  std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,pcVar3,0x8d98fa);
  bVar4 = true;
  p_Var6 = (_List_node_base *)&local_68;
  while (p_Var6 = (((_List_impl *)&p_Var6->_M_next)->_M_node).super__List_node_base._M_next,
        p_Var6 != (_List_node_base *)&local_68) {
    if (!bVar4) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    bVar4 = false;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)p_Var6[1]._M_next);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_68);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string Serialize() const {
    std::string result;
    std::list<std::string> str_list;
    for (auto& element : *this) {
      std::string item = element.Serialize();
      str_list.push_back(item);
    }

    result = "[";
    bool is_first = true;
    for (const auto& item : str_list) {
      if (!is_first) {
        result += ",";
      }
      result += item;
      is_first = false;
    }
    result += "]";

    return result;
  }